

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.h
# Opt level: O0

void * region_reserve(region *region,size_t size)

{
  rlist *prVar1;
  uint32_t uVar2;
  rslab *slab_00;
  void *pvVar3;
  bool bVar4;
  rslab *slab;
  void *ptr;
  size_t size_local;
  region *region_local;
  
  slab = (rslab *)0x0;
  if (region->reserved != 0) {
    __assert_fail("!region->reserved",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/region.h"
                  ,0xda,"void *region_reserve(struct region *, size_t)");
  }
  bVar4 = false;
  if ((region->slabs).slabs.next == (region->slabs).slabs.prev) {
    bVar4 = (slab_list *)(region->slabs).slabs.next == &region->slabs;
  }
  if (!bVar4) {
    prVar1 = (region->slabs).slabs.next;
    slab_00 = (rslab *)(prVar1 + -1);
    uVar2 = rslab_unused(slab_00);
    if (size <= uVar2) {
      pvVar3 = rslab_data(slab_00);
      slab = (rslab *)((long)pvVar3 + (ulong)*(uint *)&prVar1[2].prev);
    }
  }
  if (slab == (rslab *)0x0) {
    slab = (rslab *)region_reserve_slow(region,size);
  }
  if (slab != (rslab *)0x0) {
    region->reserved = 1;
  }
  return slab;
}

Assistant:

static inline void *
region_reserve(struct region *region, size_t size)
{
	void *ptr = NULL;
	assert(!region->reserved);
	if (! rlist_empty(&region->slabs.slabs)) {
		struct rslab *slab = rlist_first_entry(&region->slabs.slabs,
						       struct rslab,
						       slab.next_in_list);
		if (size <= rslab_unused(slab))
			ptr = (char *) rslab_data(slab) + slab->used;
	}
	if (ptr == NULL)
		ptr = region_reserve_slow(region, size);
#ifndef NDEBUG
	if (ptr != NULL)
		region->reserved = true;
#endif
	return ptr;
}